

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.h
# Opt level: O1

CallReturnNode * __thiscall
GraphBuilder::addNode<CallReturnNode>(GraphBuilder *this,CallReturnNode *node)

{
  bool bVar1;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<Node_*,_true,_false>,_bool> pVar2;
  __node_gen_type __node_gen;
  Node *local_28;
  _Hashtable<Node*,Node*,std::allocator<Node*>,std::__detail::_Identity,std::equal_to<Node*>,std::hash<Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_20;
  Node *local_18;
  
  local_28 = &node->super_Node;
  bVar1 = Node::isArtificial(&node->super_Node);
  if (bVar1) {
    local_20 = (_Hashtable<Node*,Node*,std::allocator<Node*>,std::__detail::_Identity,std::equal_to<Node*>,std::hash<Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->artificialNodes_;
    local_18 = local_28;
    pVar2 = std::
            _Hashtable<Node*,Node*,std::allocator<Node*>,std::__detail::_Identity,std::equal_to<Node*>,std::hash<Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<Node*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Node*,false>>>>
                      (local_20);
  }
  else {
    local_20 = (_Hashtable<Node*,Node*,std::allocator<Node*>,std::__detail::_Identity,std::equal_to<Node*>,std::hash<Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)Node::llvmInstruction(local_28);
    pVar2 = (pair<std::__detail::_Node_iterator<Node_*,_true,_false>,_bool>)
            std::
            _Hashtable<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,Node*>,std::allocator<std::pair<llvm::Instruction_const*const,Node*>>,std::__detail::_Select1st,std::equal_to<llvm::Instruction_const*>,std::hash<llvm::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<llvm::Instruction_const*,CallReturnNode*&>
                      ((_Hashtable<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,Node*>,std::allocator<std::pair<llvm::Instruction_const*const,Node*>>,std::__detail::_Select1st,std::equal_to<llvm::Instruction_const*>,std::hash<llvm::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->llvmToNodeMap_,&local_20,&local_28);
  }
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_28 = (Node *)0x0;
  }
  return (CallReturnNode *)local_28;
}

Assistant:

T *addNode(T *node) {
        if (node->isArtificial()) {
            if (this->artificialNodes_.insert(node).second) {
                return node;
            }
        } else {
            if (this->llvmToNodeMap_.emplace(node->llvmInstruction(), node)
                        .second) {
                return node;
            }
        }
        return nullptr;
    }